

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

uint ** Extra_TruthElementary(int nVars)

{
  uint uVar1;
  uint *puVar2;
  uint **ppuVar3;
  uint nRows;
  ulong uVar4;
  ulong uVar5;
  
  nRows = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    nRows = 1;
  }
  ppuVar3 = (uint **)Extra_ArrayAlloc(nVars,nRows,4);
  if (0 < nVars) {
    uVar4 = 0;
    do {
      if (uVar4 < 5) {
        if (0 < (int)nRows) {
          uVar1 = s_VarMasks[uVar4][1];
          puVar2 = ppuVar3[uVar4];
          uVar5 = 0;
          do {
            puVar2[uVar5] = uVar1;
            uVar5 = uVar5 + 1;
          } while (nRows != uVar5);
        }
      }
      else if (0 < (int)nRows) {
        puVar2 = ppuVar3[uVar4];
        uVar5 = 0;
        do {
          puVar2[uVar5] = -(uint)((1 << ((char)uVar4 - 5U & 0x1f) & (uint)uVar5) != 0);
          uVar5 = uVar5 + 1;
        } while (nRows != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nVars);
  }
  return ppuVar3;
}

Assistant:

unsigned ** Extra_TruthElementary( int nVars )
{
    unsigned ** pRes;
    int i, k, nWords;
    nWords = Extra_TruthWordNum(nVars);
    pRes = (unsigned **)Extra_ArrayAlloc( nVars, nWords, 4 );
    for ( i = 0; i < nVars; i++ )
    {
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pRes[i][k] = s_VarMasks[i][1];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pRes[i][k] = ~(unsigned)0;
                else
                    pRes[i][k] = 0;
        }
    }
    return pRes;
}